

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O0

string * __thiscall
TreeIncPruneBGPlanner::SoftPrintJpol_abi_cxx11_
          (TreeIncPruneBGPlanner *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_RDX;
  string *in_RDI;
  Index o;
  Index k;
  stringstream ss;
  uint local_1b8;
  uint local_1a4;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(local_18);
    if (local_1a4 == sVar1) break;
    std::operator<<(local_190,"[");
    local_1b8 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](local_18,(ulong)local_1a4);
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar2);
      if (local_1b8 == sVar1) break;
      pvVar2 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](local_18,(ulong)local_1a4);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar2,(ulong)local_1b8);
      if (*pvVar3 == 0xffffffff) {
        std::operator<<(local_190,"U");
      }
      else {
        pvVar2 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](local_18,(ulong)local_1a4);
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar2,(ulong)local_1b8);
        std::ostream::operator<<(local_190,*pvVar3);
      }
      local_1b8 = local_1b8 + 1;
    }
    std::operator<<(local_190,"]");
    local_1a4 = local_1a4 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

string TreeIncPruneBGPlanner::SoftPrintJpol(
    const vector<vector<Index> > &jpol) const
{
    stringstream ss;
    for(Index k=0;k!=jpol.size();++k)
    {
        ss << "[";
        for(Index o=0;o!=jpol[k].size();++o)
        {
            if(jpol[k][o]==UNSPECIFIED_ACTION)
                ss << "U";
            else
                ss << jpol[k][o];
        }
        ss << "]";
    }
    
    return(ss.str());
}